

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O0

int nn_ws_match_token(char *token,char **subj,int case_insensitive,int ignore_leading_sp)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  char *in_RDI;
  bool bVar3;
  char *pos;
  char *local_28;
  char *local_10;
  
  bVar3 = false;
  if (in_RDI != (char *)0x0) {
    bVar3 = *in_RSI != 0;
  }
  if (!bVar3) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","token && *subj",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/ws_handshake.c"
            ,0x112);
    fflush(_stderr);
    nn_err_abort();
  }
  local_28 = (char *)*in_RSI;
  if (in_ECX != 0) {
    while( true ) {
      bVar3 = false;
      if (*local_28 == ' ') {
        bVar3 = *local_28 != '\0';
      }
      if (!bVar3) break;
      local_28 = local_28 + 1;
    }
  }
  local_10 = in_RDI;
  if (in_EDX == 0) {
    while( true ) {
      bVar3 = false;
      if (*local_10 != '\0') {
        bVar3 = *local_28 != '\0';
      }
      if (!bVar3) break;
      if (*local_10 != *local_28) {
        return 0;
      }
      local_10 = local_10 + 1;
      local_28 = local_28 + 1;
    }
  }
  else {
    while( true ) {
      bVar3 = false;
      if (*local_10 != '\0') {
        bVar3 = *local_28 != '\0';
      }
      if (!bVar3) break;
      iVar1 = tolower((int)*local_10);
      iVar2 = tolower((int)*local_28);
      if (iVar1 != iVar2) {
        return 0;
      }
      local_10 = local_10 + 1;
      local_28 = local_28 + 1;
    }
  }
  if ((*local_28 == '\0') && (*local_10 != '\0')) {
    return 0;
  }
  if (*local_10 == '\0') {
    *in_RSI = (long)local_28;
    return 1;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!*token",
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/ws_handshake.c"
          ,0x132);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static int nn_ws_match_token (const char* token, const char **subj,
    int case_insensitive, int ignore_leading_sp)
{
    const char *pos;

    nn_assert (token && *subj);

    pos = *subj;

    if (ignore_leading_sp) {
        while (*pos == '\x20' && *pos) {
            pos++;
        }
    }

    if (case_insensitive) {
        while (*token && *pos) {
            if (tolower (*token) != tolower (*pos))
                return NN_WS_HANDSHAKE_NOMATCH;
            token++;
            pos++;
        }
    }
    else {
        while (*token && *pos) {
            if (*token != *pos)
                return NN_WS_HANDSHAKE_NOMATCH;
            token++;
            pos++;
        }
    }

    /*  Encountered end of subject before matching completed. */
    if (!*pos && *token)
        return NN_WS_HANDSHAKE_NOMATCH;

    /*  Entire token has been matched. */
    nn_assert (!*token);

    /*  On success, advance subject position. */
    *subj = pos;

    return NN_WS_HANDSHAKE_MATCH;
}